

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

int mwTestBuf(mwData *mw,char *file,int line)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint len;
  uchar *ptr;
  mwData *pmVar4;
  void *p;
  char *file_00;
  
  file_00 = "unknown";
  if (file != (char *)0x0) {
    file_00 = file;
  }
  len = 8;
  if (mwDataSize != '\0') {
    len = 0x40;
  }
  iVar1 = mwIsSafeAddr(mw,len);
  if (iVar1 == 0) {
    mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",mwCounter,file_00,(ulong)(uint)line
            ,mw);
    iVar1 = 2;
LAB_00107166:
    mwErrors = mwErrors + 1;
    iVar2 = mwFlushR();
    mwFlushingB2 = iVar2 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
  }
  else {
    if ((mw->count ^ mw->check ^ mw->size ^ (long)mw->line) != 0xfe0180) {
      mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",mwCounter,file_00,
              (ulong)(uint)line);
      mwErrors = mwErrors + 1;
      iVar1 = mwFlushR();
      mwFlushingB2 = iVar1 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar1 = mwRelink(mw,file_00,line);
      if (iVar1 == 0) {
        return 2;
      }
    }
    iVar1 = 0;
    if ((mw->prev != (mwData *)0x0) && (iVar1 = 0, mw->prev->next != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",mwCounter,file_00,
              (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
      mwErrors = mwErrors + 1;
      iVar1 = mwFlushR();
      mwFlushingB2 = iVar1 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar1 = mwRelink(mw,file_00,line);
      iVar1 = (uint)(iVar1 == 0) * 2;
    }
    if ((mw->next != (mwData *)0x0) && (mw->next->prev != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",mwCounter,file_00,
              (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
      mwErrors = mwErrors + 1;
      iVar2 = mwFlushR();
      mwFlushingB2 = iVar2 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar2 = mwRelink(mw,file_00,line);
      if (iVar2 == 0) {
        iVar1 = 2;
      }
    }
    pmVar4 = mw + 1;
    if (mwDataSize == '\0') {
      pmVar4 = mw;
    }
    lVar3 = 0;
    do {
      if (*(uchar *)((long)&pmVar4->prev + lVar3) != "mEmwAtch"[lVar3]) {
        mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,file_00,
                (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
        mwErrors = mwErrors + 1;
        iVar1 = mwFlushR();
        mwFlushingB2 = iVar1 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        iVar1 = 1;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    p = (void *)((long)&pmVar4->next + mw->size);
    iVar2 = mwIsReadAddr(p,8);
    if (iVar2 != 0) {
      lVar3 = 0;
      do {
        if (*(uchar *)((long)p + lVar3) != "mEmwAtch"[lVar3]) {
          mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,file_00,
                  (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
          iVar1 = 1;
          goto LAB_00107166;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
    }
  }
  return iVar1;
}

Assistant:

static int mwTestBuf(mwData *mw, const char *file, int line)
{
	int retv = 0;
	char *p;

	if (file == NULL) {
		file = "unknown";
	}

	if (!mwIsSafeAddr(mw, mwDataSize + mwOverflowZoneSize)) {
		mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",
				mwCounter, file, line, mw);
		mwIncErr();
		return 2;
	}

	if (mw->check != CHKVAL(mw)) {
		mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",
				mwCounter, file, line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			return 2;
		}
	}

	if (mw->prev && mw->prev->next != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}
	if (mw->next && mw->next->prev != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}

	p = ((char *)mw) + mwDataSize;
	if (mwCheckOF(p)) {
		mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}
	p += mwOverflowZoneSize + mw->size;
	if (mwIsReadAddr(p, mwOverflowZoneSize) && mwCheckOF(p)) {
		mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}

	return retv;
}